

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiments.cpp
# Opt level: O3

void FLT(ffe_t *data,uint size,uint skewIndex,uint output_elements)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ffe_t fVar11;
  ulong uVar12;
  
  uVar8 = (ulong)size;
  if (1 < size) {
    do {
      uVar7 = (uint)uVar8;
      uVar8 = (ulong)(uVar7 >> 1);
      if (skewIndex != 0) {
        uVar12 = 0;
        uVar10 = uVar7 & 0xfffffffe;
        uVar5 = (ulong)(uVar7 >> 1);
        uVar6 = uVar8;
        do {
          uVar2 = (uint)uVar12;
          if (uVar2 < uVar2 + (uVar7 >> 1)) {
            uVar1 = *(ushort *)(&DAT_0010508e + uVar12 * 2 + (ulong)uVar10);
            lVar3 = 0;
            do {
              uVar9 = (int)uVar5 + (int)lVar3;
              if (uVar1 == 0xffff) {
                fVar11 = data[uVar12 + lVar3];
              }
              else {
                if ((ulong)data[uVar9] == 0) {
                  fVar11 = 0;
                }
                else {
                  uVar4 = (uint)GFLog[data[uVar9]] + (uint)uVar1;
                  fVar11 = GFExp[(uVar4 >> 0x10) + uVar4 & 0xffff];
                }
                fVar11 = fVar11 ^ data[uVar12 + lVar3];
                data[uVar12 + lVar3] = fVar11;
              }
              data[uVar9] = data[uVar9] ^ fVar11;
              lVar3 = lVar3 + 1;
            } while (uVar6 - uVar12 != lVar3);
          }
          uVar12 = (ulong)(uVar2 + uVar10);
          uVar6 = (ulong)((int)uVar6 + uVar10);
          uVar5 = uVar5 + uVar10;
        } while (uVar2 + uVar10 < skewIndex);
      }
    } while (3 < uVar7);
  }
  return;
}

Assistant:

static void FLT(ffe_t* data, const unsigned size, const unsigned skewIndex, const unsigned output_elements)
{
    for (unsigned width = (size >> 1); width > 0; width >>= 1)
    {
        const ffe_t* skewLUT = skewVec + width + skewIndex - 1;

        for (unsigned j = 0; j < output_elements; j += (width << 1))
        {
            const ffe_t skew = skewLUT[j];

            for (unsigned i = j; i < j + width; ++i)
                fft_butterfly(data[i], data[i + width], skew);
        }
    }
}